

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

void gl4cts::GLSL420Pack::Utils::prepareBlockVariableStrings
               (SHADER_STAGES in_stage,VARIABLE_STORAGE in_storage,qualifierSet *in_qualifiers,
               GLchar *in_type_name,GLchar *in_variable_name,GLchar *in_block_name,
               string *out_definition,string *out_reference)

{
  Utils *this;
  VARIABLE_FLAVOUR VVar1;
  GLchar *qualifiers_00;
  VARIABLE_FLAVOUR flavour_00;
  GLchar *type_name;
  string local_d0;
  string local_b0;
  string local_80;
  string *local_60;
  string *name;
  Utils *local_40;
  qualifierSet *qualifiers;
  GLchar *pGStack_30;
  VARIABLE_FLAVOUR flavour;
  GLchar *in_block_name_local;
  GLchar *in_variable_name_local;
  GLchar *in_type_name_local;
  qualifierSet *in_qualifiers_local;
  VARIABLE_STORAGE in_storage_local;
  SHADER_STAGES in_stage_local;
  
  pGStack_30 = in_block_name;
  in_block_name_local = in_variable_name;
  in_variable_name_local = in_type_name;
  in_type_name_local = (GLchar *)in_qualifiers;
  in_qualifiers_local._0_4_ = in_storage;
  in_qualifiers_local._4_4_ = in_stage;
  qualifiers._4_4_ = getVariableFlavour(in_stage,in_storage,in_qualifiers);
  prepareQualifiersSet
            ((qualifierSet *)&name,(qualifierSet *)in_type_name_local,in_qualifiers_local._4_4_,
             (VARIABLE_STORAGE)in_qualifiers_local);
  local_40 = (Utils *)&name;
  getVariableName_abi_cxx11_
            (&local_80,(Utils *)(ulong)in_qualifiers_local._4_4_,
             (VARIABLE_STORAGE)in_qualifiers_local,(VARIABLE_STORAGE)in_block_name_local,
             in_variable_name);
  qualifiers_00 = in_variable_name_local;
  this = local_40;
  local_60 = &local_80;
  type_name = (GLchar *)std::__cxx11::string::c_str();
  getBlockVariableDefinition_abi_cxx11_
            (&local_b0,this,(qualifierSet *)qualifiers_00,type_name,in_variable_name);
  std::__cxx11::string::operator=((string *)out_definition,(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  VVar1 = qualifiers._4_4_;
  flavour_00 = std::__cxx11::string::c_str();
  getBlockVariableReference_abi_cxx11_
            (&local_d0,(Utils *)(ulong)VVar1,flavour_00,pGStack_30,in_variable_name);
  std::__cxx11::string::operator=((string *)out_reference,(string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_80);
  std::
  vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ::~vector((vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
             *)&name);
  return;
}

Assistant:

void Utils::prepareBlockVariableStrings(Utils::SHADER_STAGES in_stage, Utils::VARIABLE_STORAGE in_storage,
										const Utils::qualifierSet& in_qualifiers, const glw::GLchar* in_type_name,
										const glw::GLchar* in_variable_name, const glw::GLchar* in_block_name,
										std::string& out_definition, std::string& out_reference)
{
	VARIABLE_FLAVOUR	flavour	= getVariableFlavour(in_stage, in_storage, in_qualifiers);
	const qualifierSet& qualifiers = prepareQualifiersSet(in_qualifiers, in_stage, in_storage);
	const std::string&  name	   = getVariableName(in_stage, in_storage, in_variable_name);

	out_definition = getBlockVariableDefinition(qualifiers, in_type_name, name.c_str());
	out_reference  = getBlockVariableReference(flavour, name.c_str(), in_block_name);
}